

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_reader.cc
# Opt level: O2

unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_> __thiscall
draco::StdioFileReader::Open(StdioFileReader *this,string *file_name)

{
  FILE *__stream;
  _func_int **pp_Var1;
  
  if ((file_name->_M_string_length != 0) &&
     (__stream = fopen64((file_name->_M_dataplus)._M_p,"rb"), __stream != (FILE *)0x0)) {
    pp_Var1 = (_func_int **)operator_new(0x10,(nothrow_t *)&std::nothrow);
    if (pp_Var1 != (_func_int **)0x0) {
      *pp_Var1 = (_func_int *)&PTR__StdioFileReader_0017bd60;
      pp_Var1[1] = (_func_int *)__stream;
      (this->super_FileReaderInterface)._vptr_FileReaderInterface = pp_Var1;
      return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
              )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
                )this;
    }
    fprintf(_stderr,"%s:%d (%s): %s.\n",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]draco/src/draco/io/stdio_file_reader.cc"
            ,0x2c,"Open","Out of memory");
    fclose(__stream);
  }
  (this->super_FileReaderInterface)._vptr_FileReaderInterface = (_func_int **)0x0;
  return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FileReaderInterface> StdioFileReader::Open(
    const std::string &file_name) {
  if (file_name.empty()) {
    return nullptr;
  }

  FILE *raw_file_ptr = fopen(file_name.c_str(), "rb");

  if (raw_file_ptr == nullptr) {
    return nullptr;
  }

  std::unique_ptr<FileReaderInterface> file(new (std::nothrow)
                                                StdioFileReader(raw_file_ptr));
  if (file == nullptr) {
    FILEREADER_LOG_ERROR("Out of memory");
    fclose(raw_file_ptr);
    return nullptr;
  }

  return file;
}